

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

bool __thiscall crnlib::vector<float>::try_resize(vector<float> *this,uint new_size,bool grow_hint)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = this->m_size;
  if (uVar2 != new_size) {
    if (uVar2 <= new_size) {
      if (this->m_capacity < new_size) {
        bVar1 = elemental_vector::increase_capacity
                          ((elemental_vector *)this,new_size,uVar2 + 1 == new_size || grow_hint,4,
                           (object_mover)0x0,true);
        if (!bVar1) {
          return false;
        }
        uVar2 = this->m_size;
      }
      memset(this->m_p + uVar2,0,(ulong)(new_size - uVar2) << 2);
    }
    this->m_size = new_size;
  }
  return true;
}

Assistant:

inline bool try_resize(uint new_size, bool grow_hint = false) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity) {
          if (!increase_capacity(new_size, (new_size == (m_size + 1)) || grow_hint, true))
            return false;
        }

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }

    return true;
  }